

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::readPixels(InputFile *this,int scanLine1,int scanLine2)

{
  long in_RDI;
  Lock lock;
  int in_stack_000000f8;
  int in_stack_000000fc;
  Data *in_stack_00000100;
  int in_stack_00000218;
  int in_stack_0000021c;
  ScanLineInputFile *in_stack_00000220;
  int in_stack_000002e8;
  int in_stack_000002ec;
  CompositeDeepScanLine *in_stack_000002f0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  Mutex *in_stack_ffffffffffffffd8;
  Lock *in_stack_ffffffffffffffe0;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 200) == 0) {
    if ((*(byte *)(*(long *)(in_RDI + 8) + 100) & 1) == 0) {
      ScanLineInputFile::readPixels(in_stack_00000220,in_stack_0000021c,in_stack_00000218);
    }
    else {
      IlmThread_2_5::Lock::Lock
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7
                );
      anon_unknown_21::bufferedReadPixels(in_stack_00000100,in_stack_000000fc,in_stack_000000f8);
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    }
  }
  else {
    CompositeDeepScanLine::readPixels(in_stack_000002f0,in_stack_000002ec,in_stack_000002e8);
  }
  return;
}

Assistant:

void
InputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_data->compositor)
    {
        _data->compositor->readPixels(scanLine1,scanLine2);
    }
    else if (_data->isTiled)
    {
	Lock lock (*_data);
        bufferedReadPixels (_data, scanLine1, scanLine2);
    }
    else
    {
        _data->sFile->readPixels (scanLine1, scanLine2);
    }
}